

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hh
# Opt level: O2

void __thiscall EnvDecl::EnvDecl(EnvDecl *this,string *n,string *s)

{
  std::__cxx11::string::string((string *)this,(string *)n);
  std::__cxx11::string::string((string *)&this->source,(string *)s);
  return;
}

Assistant:

EnvDecl(std::string n, std::string s)
        : name(n)
        , source(s)
    {
    }